

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O3

void __thiscall Snes_Spc::ram_loaded(Snes_Spc *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t (*pauVar3) [16];
  
  (this->m).rom_enabled = 0;
  uVar1 = *(undefined8 *)((this->m).ram.ram + 0xf0);
  uVar2 = *(undefined8 *)((this->m).ram.ram + 0xf8);
  *(undefined8 *)(this->m).smp_regs[0] = uVar1;
  *(undefined8 *)((this->m).smp_regs[0] + 8) = uVar2;
  *(undefined8 *)(this->m).smp_regs[1] = uVar1;
  *(undefined8 *)((this->m).smp_regs[1] + 8) = uVar2;
  *(uint8_t *)((long)((this->m).smp_regs + 1) + 0) = '\0';
  *(uint8_t *)((long)((this->m).smp_regs + 1) + 1) = '\0';
  pauVar3 = (this->m).smp_regs;
  *(uint8_t *)((long)(pauVar3 + 1) + 10) = '\0';
  *(uint8_t *)((long)(pauVar3 + 1) + 0xb) = '\0';
  (this->m).smp_regs[1][0xc] = '\0';
  memset(&(this->m).ram,0xff,0x100);
  memset((this->m).ram.padding2,0xff,0x100);
  return;
}

Assistant:

void Snes_Spc::ram_loaded()
{
	m.rom_enabled = 0;
	load_regs( &RAM [0xF0] );
	
	// Put STOP instruction around memory to catch PC underflow/overflow
	memset( m.ram.padding1, cpu_pad_fill, sizeof m.ram.padding1 );
	memset( m.ram.padding2, cpu_pad_fill, sizeof m.ram.padding2 );
}